

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveness_sim.c
# Opt level: O3

Vec_Ptr_t * populateLivenessVector(Abc_Ntk_t *pNtk,Aig_Man_t *pAig)

{
  void *pvVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  Vec_Ptr_t *pVVar4;
  char *pcVar5;
  long lVar6;
  uint uVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  
  pVVar2 = (Vec_Ptr_t *)malloc(0x10);
  pVVar2->nCap = 100;
  pVVar2->nSize = 0;
  ppvVar3 = (void **)malloc(800);
  pVVar2->pArray = ppvVar3;
  pVVar4 = pNtk->vPos;
  if (pVVar4->nSize < 1) {
    uVar7 = 0;
  }
  else {
    iVar9 = 0;
    uVar11 = 100;
    lVar8 = 0;
    uVar7 = 0;
    do {
      pcVar5 = Abc_ObjName((Abc_Obj_t *)pVVar4->pArray[lVar8]);
      pcVar5 = strstr(pcVar5,"assert_fair");
      if (pcVar5 != (char *)0x0) {
        if (pAig->vCos->nSize <= lVar8) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pvVar1 = pAig->vCos->pArray[lVar8];
        iVar10 = (int)uVar11;
        if (iVar9 == iVar10) {
          if (iVar10 < 0x10) {
            if (pVVar2->pArray == (void **)0x0) {
              ppvVar3 = (void **)malloc(0x80);
            }
            else {
              ppvVar3 = (void **)realloc(pVVar2->pArray,0x80);
            }
            pVVar2->pArray = ppvVar3;
            pVVar2->nCap = 0x10;
            uVar11 = 0x10;
          }
          else {
            uVar11 = (ulong)(uint)(iVar10 * 2);
            if (pVVar2->pArray == (void **)0x0) {
              ppvVar3 = (void **)malloc(uVar11 * 8);
            }
            else {
              ppvVar3 = (void **)realloc(pVVar2->pArray,uVar11 * 8);
            }
            pVVar2->pArray = ppvVar3;
            pVVar2->nCap = iVar10 * 2;
          }
        }
        else {
          ppvVar3 = pVVar2->pArray;
        }
        lVar6 = (long)iVar9;
        iVar9 = iVar9 + 1;
        pVVar2->nSize = iVar9;
        ppvVar3[lVar6] = pvVar1;
        uVar7 = uVar7 + 1;
      }
      lVar8 = lVar8 + 1;
      pVVar4 = pNtk->vPos;
    } while (lVar8 < pVVar4->nSize);
  }
  printf("\nNumber of liveness property found = %d\n",(ulong)uVar7);
  return pVVar2;
}

Assistant:

static Vec_Ptr_t * populateLivenessVector( Abc_Ntk_t *pNtk, Aig_Man_t *pAig )
{
    Abc_Obj_t * pNode;
    int i, liveCounter = 0;
    Vec_Ptr_t * vLive;

    vLive = Vec_PtrAlloc( 100 );
    Abc_NtkForEachPo( pNtk, pNode, i )
        if( strstr( Abc_ObjName( pNode ), "assert_fair") != NULL )
        {
            Vec_PtrPush( vLive, Aig_ManCo( pAig, i ) );
            liveCounter++;
        }
    printf("\nNumber of liveness property found = %d\n", liveCounter);
    return vLive;
}